

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::GetTargetVersion(cmGeneratorTarget *this,int *major,int *minor)

{
  int patch;
  allocator<char> local_45;
  int local_44;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"VERSION",&local_45);
  GetTargetVersion(this,&local_40,major,minor,&local_44);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(int& major, int& minor) const
{
  int patch;
  this->GetTargetVersion("VERSION", major, minor, patch);
}